

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

void __thiscall
despot::RockSampleMMAPStateScenarioLowerBound::RockSampleMMAPStateScenarioLowerBound
          (RockSampleMMAPStateScenarioLowerBound *this,DSPOMDP *model)

{
  vector<int,std::allocator<int>> *this_00;
  int a;
  int iVar1;
  Grid<int> *this_01;
  iterator __position;
  int iVar2;
  uint uVar3;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *__x;
  int *piVar4;
  int s;
  ulong uVar5;
  BaseRockSample *this_02;
  ulong uVar6;
  int rock;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> policy;
  int local_84;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> local_80;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  despot::ScenarioLowerBound::ScenarioLowerBound(&this->super_ScenarioLowerBound,model);
  this_02 = (BaseRockSample *)(model + -0x38);
  if (model == (DSPOMDP *)0x0) {
    this_02 = (BaseRockSample *)0x0;
  }
  *(undefined ***)this = &PTR__RockSampleMMAPStateScenarioLowerBound_0011a8f0;
  this->rs_model_ = this_02;
  this->grid_ = &this_02->grid_;
  local_68 = &this->rock_order_;
  (this->rock_order_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rock_order_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rock_order_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = BaseRockSample::ComputeOptimalSamplingPolicy(this_02);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector(&local_80,__x);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_60,
           (long)local_80.
                 super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_80.
                 super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_84);
  local_48.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->rock_order_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->rock_order_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->rock_order_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->rock_order_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_60.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->rock_order_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_60.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->rock_order_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_60.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_60.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_60);
  if (local_80.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_80.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      uVar5 = uVar6 & 0xffffffff;
      while( true ) {
        s = (int)uVar5;
        if (((long)local_80.
                   super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_80.
                   super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4) + -1 == (long)s) break;
        a = *(int *)(local_80.
                     super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)s * 0x10);
        if (a == 4) {
          iVar2 = s >> ((byte)this->rs_model_->num_rocks_ & 0x1f);
          this_01 = this->grid_;
          iVar1 = (this->rs_model_->grid_).xsize_;
          despot::Coord::Coord((Coord *)&local_48,iVar2 % iVar1,iVar2 / iVar1);
          local_60.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_48.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          piVar4 = Grid<int>::operator()(this_01,(Coord *)&local_60);
          local_84 = *piVar4;
          if (local_84 < 0) {
            exit(0);
          }
          this_00 = (vector<int,std::allocator<int>> *)
                    ((local_68->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar6);
          __position._M_current = *(int **)(this_00 + 8);
          if (__position._M_current == *(int **)(this_00 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this_00,__position,&local_84);
          }
          else {
            *__position._M_current = local_84;
            *(int **)(this_00 + 8) = __position._M_current + 1;
          }
        }
        uVar3 = BaseRockSample::NextState(this->rs_model_,s,a);
        uVar5 = (ulong)uVar3;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)local_80.
                                   super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_80.
                                   super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (local_80.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

RockSampleMMAPStateScenarioLowerBound(const DSPOMDP* model) :
		ScenarioLowerBound(model),
		rs_model_(static_cast<const BaseRockSample*>(model)),
		grid_(rs_model_->grid_) {
		const vector<ValuedAction> policy =
			rs_model_->ComputeOptimalSamplingPolicy();
		rock_order_ = vector<vector<int> >(policy.size());
		for (int s = 0; s < policy.size(); s++) {
			int cur = s;
			while (cur != policy.size() - 1) {
				ACT_TYPE action = policy[cur].action;
				if (action == rs_model_->E_SAMPLE) {
					int rock = grid_(
						rs_model_->IndexToCoord(cur >> rs_model_->num_rocks_));
					if (rock < 0)
						exit(0);
					rock_order_[s].push_back(rock);
				}
				cur = rs_model_->NextState(cur, action);
			}
		}
	}